

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftext.c
# Opt level: O0

int fftInit(long M)

{
  float *pfVar1;
  short *psVar2;
  ulong in_RDI;
  int theError;
  float *in_stack_ffffffffffffffe8;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  
  iVar3 = 1;
  if (((-1 < (long)in_RDI) && (in_RDI < 0x40)) && (iVar3 = 0, UtblArray[in_RDI] == (float *)0x0)) {
    pfVar1 = (float *)malloc((((ulong)(1L << ((byte)in_RDI & 0x3f)) >> 2) + 1) * 4);
    UtblArray[in_RDI] = pfVar1;
    if (UtblArray[in_RDI] == (float *)0x0) {
      iVar3 = 2;
    }
    else {
      fftCosInit(CONCAT44(iVar3,in_stack_fffffffffffffff0),in_stack_ffffffffffffffe8);
    }
    if ((1 < (long)in_RDI) && (BRLowArray[(long)in_RDI / 2] == (short *)0x0)) {
      psVar2 = (short *)malloc((1L << ((char)((long)in_RDI / 2) - 1U & 0x3f)) << 1);
      BRLowArray[(long)in_RDI / 2] = psVar2;
      if (BRLowArray[(long)in_RDI / 2] == (short *)0x0) {
        iVar3 = 2;
      }
      else {
        fftBRInit(in_RDI,BRLowArray[(long)in_RDI / 2]);
      }
    }
    if ((2 < (long)in_RDI) && (BRLowArray[(long)(in_RDI - 1) / 2] == (short *)0x0)) {
      psVar2 = (short *)malloc((1L << ((char)((long)(in_RDI - 1) / 2) - 1U & 0x3f)) << 1);
      BRLowArray[(long)(in_RDI - 1) / 2] = psVar2;
      if (BRLowArray[(long)(in_RDI - 1) / 2] == (short *)0x0) {
        iVar3 = 2;
      }
      else {
        fftBRInit(in_RDI - 1,BRLowArray[(long)(in_RDI - 1) / 2]);
      }
    }
  }
  return iVar3;
}

Assistant:

int fftInit(long M){
// malloc and init cosine and bit reversed tables for a given size fft, ifft, rfft, rifft
/* INPUTS */
/* M = log2 of fft size	(ex M=10 for 1024 point fft) */
/* OUTPUTS */
/* private cosine and bit reversed tables	*/

int theError = 1;
/*** I did NOT test cases with M>27 ***/
if ((M >= 0) && (M < 8*sizeof(long))){
	theError = 0;
	if (UtblArray[M] == 0){	// have we not inited this size fft yet?
		// init cos table
		UtblArray[M] = (float *) malloc( (POW2(M)/4+1)*sizeof(float) );
		if (UtblArray[M] == 0)
			theError = 2;
		else{
			fftCosInit(M, UtblArray[M]);
		}
		if (M > 1){
			if (BRLowArray[M/2] == 0){	// init bit reversed table for cmplx fft
				BRLowArray[M/2] = (short *) malloc( POW2(M/2-1)*sizeof(short) );
				if (BRLowArray[M/2] == 0)
					theError = 2;
				else{
					fftBRInit(M, BRLowArray[M/2]);
				}
			}
		}
		if (M > 2){
			if (BRLowArray[(M-1)/2] == 0){	// init bit reversed table for real fft
				BRLowArray[(M-1)/2] = (short *) malloc( POW2((M-1)/2-1)*sizeof(short) );
				if (BRLowArray[(M-1)/2] == 0)
					theError = 2;
				else{
					fftBRInit(M-1, BRLowArray[(M-1)/2]);
				}
			}
		}
	}
};
return theError;
}